

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.cpp
# Opt level: O2

void __thiscall zmq::xpub_t::xread_activated(xpub_t *this,pipe_t *pipe_)

{
  uint uVar1;
  byte bVar2;
  rm_result rVar3;
  ssize_t sVar4;
  byte *pbVar5;
  byte *prefix_;
  size_t sVar6;
  bool bVar7;
  ulong in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  int __fd;
  msg_t *pmVar8;
  value_type *__x;
  uchar *__args;
  bool bVar10;
  uchar local_c9;
  metadata_t *metadata;
  pipe_t *pipe__local;
  generic_mtrie_t<zmq::pipe_t> *local_b8;
  generic_mtrie_t<zmq::pipe_t> *local_b0;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *local_a8;
  deque<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_> *local_a0;
  deque<zmq::blob_t,_std::allocator<zmq::blob_t>_> *local_98;
  deque<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *local_90;
  blob_t notification;
  msg_t msg;
  blob_t *pbVar9;
  
  local_98 = &this->_pending_data;
  local_a0 = &this->_pending_metadata;
  local_a8 = &this->_pending_flags;
  local_b0 = &this->_subscriptions;
  local_b8 = &this->_manual_subscriptions;
  local_90 = &this->_pending_pipes;
  pipe__local = pipe_;
  do {
    pmVar8 = &msg;
    sVar4 = pipe_t::read(pipe__local,(int)&msg,in_RDX,in_RCX);
    __fd = (int)pmVar8;
    if ((char)sVar4 == '\0') {
      return;
    }
    metadata = msg_t::metadata(&msg);
    pbVar5 = (byte *)msg_t::data(&msg);
    bVar7 = this->_more_recv;
    bVar2 = msg_t::flags(&msg);
    this->_more_recv = (bool)(bVar2 & 1);
    if ((bVar7 == true) && (this->_process_subscribe != true)) {
LAB_001b702d:
      if ((this->super_socket_base_t).super_own_t.options.type != '\x01') {
        sVar6 = msg_t::size(&msg);
        blob_t::blob_t(&notification,pbVar5,sVar6);
        std::deque<zmq::blob_t,_std::allocator<zmq::blob_t>_>::emplace_back<zmq::blob_t>
                  (local_98,&notification);
        blob_t::~blob_t(&notification);
        if (metadata != (metadata_t *)0x0) {
          metadata_t::add_ref(metadata);
        }
        std::deque<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>::push_back
                  (local_a0,&metadata);
        notification._data._0_1_ = msg_t::flags(&msg);
        pbVar9 = &notification;
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (local_a8,(uchar *)&notification);
        __fd = (int)pbVar9;
      }
    }
    else {
      if (((msg._u.base.flags & 0x1c) == 0x10) || ((msg._u.base.flags & 0x1c) == 0xc)) {
        prefix_ = (byte *)msg_t::command_body(&msg);
        sVar6 = msg_t::command_body_size(&msg);
        bVar10 = (msg._u.base.flags & 0x1c) == 0xc;
LAB_001b6f9e:
        bVar2 = 1;
      }
      else {
        sVar6 = msg_t::size(&msg);
        if ((sVar6 != 0) && (*pbVar5 < 2)) {
          prefix_ = pbVar5 + 1;
          sVar6 = msg_t::size(&msg);
          sVar6 = sVar6 - 1;
          bVar10 = *pbVar5 == 1;
          goto LAB_001b6f9e;
        }
        bVar2 = 0;
        bVar10 = false;
        sVar6 = 0;
        prefix_ = (byte *)0x0;
      }
      if (bVar7 == false) {
        bVar7 = (bool)(this->_only_first_subscribe ^ 1U | bVar2);
        in_RCX = CONCAT71((int7)(in_RCX >> 8),bVar7);
        this->_process_subscribe = bVar7;
      }
      if (bVar2 == 0) goto LAB_001b702d;
      if (this->_manual == true) {
        if (bVar10 == false) {
          generic_mtrie_t<zmq::pipe_t>::rm(local_b8,prefix_,sVar6,pipe__local);
        }
        else {
          generic_mtrie_t<zmq::pipe_t>::add(local_b8,prefix_,sVar6,pipe__local);
        }
        __x = &pipe__local;
        std::deque<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::push_back(local_90,__x);
        __fd = (int)__x;
        in_RCX = 0;
      }
      else if (bVar10 == false) {
        pbVar5 = prefix_;
        rVar3 = generic_mtrie_t<zmq::pipe_t>::rm(local_b0,prefix_,sVar6,pipe__local);
        __fd = (int)pbVar5;
        in_RCX = (ulong)this->_verbose_unsubs;
        if (rVar3 != values_remain) {
          in_RCX = 1;
        }
      }
      else {
        pbVar5 = prefix_;
        bVar7 = generic_mtrie_t<zmq::pipe_t>::add(local_b0,prefix_,sVar6,pipe__local);
        __fd = (int)pbVar5;
        in_RCX = 1;
        if (!bVar7) {
          uVar1._0_1_ = this->_verbose_subs;
          uVar1._1_1_ = this->_verbose_unsubs;
          uVar1._2_1_ = this->_more_send;
          uVar1._3_1_ = this->_more_recv;
          in_RCX = (ulong)uVar1;
        }
      }
      if ((this->_manual != false) ||
         (((this->super_socket_base_t).super_own_t.options.type == '\t' && ((in_RCX & 1) != 0)))) {
        blob_t::blob_t(&notification,sVar6 + 1);
        *(bool *)CONCAT71(notification._data._1_7_,(uchar)notification._data) = bVar10;
        memcpy((void *)(CONCAT71(notification._data._1_7_,(uchar)notification._data) + 1),prefix_,
               sVar6);
        std::deque<zmq::blob_t,_std::allocator<zmq::blob_t>_>::emplace_back<zmq::blob_t>
                  (local_98,&notification);
        if (metadata != (metadata_t *)0x0) {
          metadata_t::add_ref(metadata);
        }
        std::deque<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>::push_back
                  (local_a0,&metadata);
        local_c9 = '\0';
        __args = &local_c9;
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (local_a8,__args);
        __fd = (int)__args;
        blob_t::~blob_t(&notification);
      }
    }
    msg_t::close(&msg,__fd);
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

void zmq::xpub_t::xread_activated (pipe_t *pipe_)
{
    //  There are some subscriptions waiting. Let's process them.
    msg_t msg;
    while (pipe_->read (&msg)) {
        metadata_t *metadata = msg.metadata ();
        unsigned char *msg_data = static_cast<unsigned char *> (msg.data ()),
                      *data = NULL;
        size_t size = 0;
        bool subscribe = false;
        bool is_subscribe_or_cancel = false;
        bool notify = false;

        const bool first_part = !_more_recv;
        _more_recv = (msg.flags () & msg_t::more) != 0;

        if (first_part || _process_subscribe) {
            //  Apply the subscription to the trie
            if (msg.is_subscribe () || msg.is_cancel ()) {
                data = static_cast<unsigned char *> (msg.command_body ());
                size = msg.command_body_size ();
                subscribe = msg.is_subscribe ();
                is_subscribe_or_cancel = true;
            } else if (msg.size () > 0 && (*msg_data == 0 || *msg_data == 1)) {
                data = msg_data + 1;
                size = msg.size () - 1;
                subscribe = *msg_data == 1;
                is_subscribe_or_cancel = true;
            }
        }

        if (first_part)
            _process_subscribe =
              !_only_first_subscribe || is_subscribe_or_cancel;

        if (is_subscribe_or_cancel) {
            if (_manual) {
                // Store manual subscription to use on termination
                if (!subscribe)
                    _manual_subscriptions.rm (data, size, pipe_);
                else
                    _manual_subscriptions.add (data, size, pipe_);

                _pending_pipes.push_back (pipe_);
            } else {
                if (!subscribe) {
                    const mtrie_t::rm_result rm_result =
                      _subscriptions.rm (data, size, pipe_);
                    //  TODO reconsider what to do if rm_result == mtrie_t::not_found
                    notify =
                      rm_result != mtrie_t::values_remain || _verbose_unsubs;
                } else {
                    const bool first_added =
                      _subscriptions.add (data, size, pipe_);
                    notify = first_added || _verbose_subs;
                }
            }

            //  If the request was a new subscription, or the subscription
            //  was removed, or verbose mode or manual mode are enabled, store it
            //  so that it can be passed to the user on next recv call.
            if (_manual || (options.type == ZMQ_XPUB && notify)) {
                //  ZMTP 3.1 hack: we need to support sub/cancel commands, but
                //  we can't give them back to userspace as it would be an API
                //  breakage since the payload of the message is completely
                //  different. Manually craft an old-style message instead.
                //  Although with other transports it would be possible to simply
                //  reuse the same buffer and prefix a 0/1 byte to the topic, with
                //  inproc the subscribe/cancel command string is not present in
                //  the message, so this optimization is not possible.
                //  The pushback makes a copy of the data array anyway, so the
                //  number of buffer copies does not change.
                blob_t notification (size + 1);
                if (subscribe)
                    *notification.data () = 1;
                else
                    *notification.data () = 0;
                memcpy (notification.data () + 1, data, size);

                _pending_data.push_back (ZMQ_MOVE (notification));
                if (metadata)
                    metadata->add_ref ();
                _pending_metadata.push_back (metadata);
                _pending_flags.push_back (0);
            }
        } else if (options.type != ZMQ_PUB) {
            //  Process user message coming upstream from xsub socket,
            //  but not if the type is PUB, which never processes user
            //  messages
            _pending_data.push_back (blob_t (msg_data, msg.size ()));
            if (metadata)
                metadata->add_ref ();
            _pending_metadata.push_back (metadata);
            _pending_flags.push_back (msg.flags ());
        }

        msg.close ();
    }
}